

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O0

int forwsearch(int f,int n)

{
  int iVar1;
  int s;
  int n_local;
  int f_local;
  
  n_local = readpattern("Search");
  if (n_local == 1) {
    iVar1 = forwsrch();
    if (iVar1 == 0) {
      dobeep();
      ewprintf("Search failed: \"%s\"",pat);
      n_local = 0;
    }
    else {
      srch_lastdir = -1;
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
forwsearch(int f, int n)
{
	int	s;

	if ((s = readpattern("Search")) != TRUE)
		return (s);
	if (forwsrch() == FALSE) {
		dobeep();
		ewprintf("Search failed: \"%s\"", pat);
		return (FALSE);
	}
	srch_lastdir = SRCH_FORW;
	return (TRUE);
}